

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O0

void test_ffffffff_and_friends(void)

{
  void *pvVar1;
  void *pvVar2;
  int i_2;
  int i_1;
  int i;
  void *c;
  uint local_14;
  uint local_10;
  uint local_c;
  
  pvVar1 = (*hm_new)();
  for (local_c = 0; local_c < 7; local_c = local_c + 1) {
    (*hm_insert)(pvVar1,test_ffffffff_and_friends::vals[(int)local_c],
                 (void *)(test_ffffffff_and_friends::vals[(int)local_c] ^ 0xffffffffffffffff),0);
  }
  local_10 = 0;
  while( true ) {
    if (6 < local_10) {
      local_14 = 0;
      while( true ) {
        if (6 < local_14) {
          (*hm_delete)(pvVar1);
          return;
        }
        pvVar2 = (*hm_remove)(pvVar1,test_ffffffff_and_friends::vals[(int)local_14]);
        if (pvVar2 != (void *)(test_ffffffff_and_friends::vals[(int)local_14] ^ 0xffffffffffffffff))
        break;
        local_14 = local_14 + 1;
      }
      pvVar1 = (*hm_remove)(pvVar1,test_ffffffff_and_friends::vals[(int)local_14]);
      printf(anon_var_dwarf_28f,"hm_remove(c, vals[i])",pvVar1,"(void*)~vals[i]",
             test_ffffffff_and_friends::vals[(int)local_14] ^ 0xffffffffffffffff,0x6a);
      bad = 1;
      exit(1);
    }
    pvVar2 = (*hm_get)(pvVar1,test_ffffffff_and_friends::vals[(int)local_10]);
    if (pvVar2 != (void *)(test_ffffffff_and_friends::vals[(int)local_10] ^ 0xffffffffffffffff))
    break;
    local_10 = local_10 + 1;
  }
  pvVar1 = (*hm_get)(pvVar1,test_ffffffff_and_friends::vals[(int)local_10]);
  printf(anon_var_dwarf_28f,"hm_get(c, vals[i])",pvVar1,"(void*)~vals[i]",
         test_ffffffff_and_friends::vals[(int)local_10] ^ 0xffffffffffffffff,0x68);
  bad = 1;
  exit(1);
}

Assistant:

static void test_ffffffff_and_friends()
{
    static word vals[]=
    {
        0,
        0x7fffffff,
        0x80000000,
        0xffffffff,
#if __SIZEOF_SIZE_T__ == 8
        0x7fffffffFFFFFFFF,
        0x8000000000000000,
        0xFfffffffFFFFFFFF,
#endif
    };

    void *c = hm_new();
    for (int i=0; i<ARRAYSZ(vals); i++)
        hm_insert(c, vals[i], (void*)~vals[i], 0);
    for (int i=0; i<ARRAYSZ(vals); i++)
        CHECK(hm_get(c, vals[i]), (void*)~vals[i]);
    for (int i=0; i<ARRAYSZ(vals); i++)
        CHECK(hm_remove(c, vals[i]), (void*)~vals[i]);
    hm_delete(c);
}